

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  Value temp;
  Value local_20;
  
  Value(&local_20,other);
  swap(this,&local_20);
  ~Value(&local_20);
  return this;
}

Assistant:

Value&
Value::operator= ( const Value& other )
{
    Value temp ( other );
    swap ( temp );
    return *this;
}